

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void duckdb::AggregateExecutor::
     UnaryFlatLoop<duckdb::StddevState,double,duckdb::StandardErrorOfTheMeanOperation>
               (double *idata,AggregateInputData *aggr_input_data,StddevState **states,
               ValidityMask *mask,idx_t count)

{
  unsigned_long *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t iVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  ulong uVar9;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    for (iVar5 = 0; count != iVar5; iVar5 = iVar5 + 1) {
      STDDevBaseOperation::Execute<double,duckdb::StddevState>(states[iVar5],idata);
      idata = idata + 1;
    }
  }
  else {
    uVar6 = 0;
    for (uVar4 = 0; uVar4 != count + 0x3f >> 6; uVar4 = uVar4 + 1) {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
LAB_01c053fa:
        pdVar8 = idata + uVar6;
        for (; uVar3 = uVar6, uVar6 < uVar9; uVar6 = uVar6 + 1) {
          STDDevBaseOperation::Execute<double,duckdb::StddevState>(states[uVar6],pdVar8);
          pdVar8 = pdVar8 + 1;
        }
      }
      else {
        uVar2 = puVar1[uVar4];
        uVar9 = uVar6 + 0x40;
        if (count <= uVar6 + 0x40) {
          uVar9 = count;
        }
        if (uVar2 == 0xffffffffffffffff) goto LAB_01c053fa;
        uVar3 = uVar9;
        if (uVar2 != 0) {
          pdVar8 = idata + uVar6;
          for (uVar7 = 0; uVar3 = uVar7 + uVar6, uVar7 + uVar6 < uVar9; uVar7 = uVar7 + 1) {
            if ((uVar2 >> (uVar7 & 0x3f) & 1) != 0) {
              STDDevBaseOperation::Execute<double,duckdb::StddevState>(states[uVar6 + uVar7],pdVar8)
              ;
            }
            pdVar8 = pdVar8 + 1;
          }
        }
      }
      uVar6 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void UnaryFlatLoop(const INPUT_TYPE *__restrict idata, AggregateInputData &aggr_input_data,
	                                 STATE_TYPE **__restrict states, ValidityMask &mask, idx_t count) {
		if (OP::IgnoreNull() && !mask.AllValid()) {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &base_idx = input.input_idx;
			base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx], input);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[base_idx], idata[base_idx],
							                                                   input);
						}
					}
				}
			}
		} else {
			AggregateUnaryInput input(aggr_input_data, mask);
			auto &i = input.input_idx;
			for (i = 0; i < count; i++) {
				OP::template Operation<INPUT_TYPE, STATE_TYPE, OP>(*states[i], idata[i], input);
			}
		}
	}